

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O0

int __thiscall Bracket::copy(Bracket *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  int iVar2;
  Bracket *this_00;
  undefined4 extraout_var;
  value_type local_50;
  reference local_48;
  Atom **i;
  iterator __end1;
  iterator __begin1;
  list<Atom_*,_std::allocator<Atom_*>_> *__range1;
  Bracket *result;
  Bracket *this_local;
  
  this_00 = (Bracket *)operator_new(0x40);
  Bracket(this_00);
  std::__cxx11::string::operator=((string *)&this_00->func,(string *)&this->func);
  __end1 = std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::begin(&this->para);
  i = (Atom **)std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::end(&this->para);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar1) break;
    local_48 = std::_List_iterator<Atom_*>::operator*(&__end1);
    iVar2 = (*(*local_48)->_vptr_Atom[4])();
    local_50 = (value_type)CONCAT44(extraout_var,iVar2);
    std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back(&this_00->para,&local_50);
    std::_List_iterator<Atom_*>::operator++(&__end1);
  }
  return (int)this_00;
}

Assistant:

Atom *Bracket::copy() {
    auto result = new Bracket();
    result->func = func;
    for (auto &i: para) {
        result->para.push_back(i->copy());
    }
    return result;
}